

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O3

void __thiscall SGParser::Generator::NFA::Or(NFA *this,NFA *b)

{
  pointer *pppNVar1;
  pointer ppNVar2;
  iterator __position;
  NFANode *target;
  pointer ppNVar3;
  NFA *this_00;
  NFANode *pNVar4;
  NFANode *local_50;
  NFANode *pfinalState;
  NFANode *local_40;
  NFA *local_38;
  
  if ((this != b) &&
     (pNVar4 = this->pStartState, b->pStartState != (NFANode *)0x0 || pNVar4 != (NFANode *)0x0)) {
    local_38 = b;
    pfinalState = (NFANode *)operator_new(0x38);
    *(undefined8 *)&pfinalState->AcceptingState = 0;
    *(undefined8 *)
     ((long)&(pfinalState->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&(pfinalState->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(pfinalState->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)
     ((long)&(pfinalState->LinkPtr).
             super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&(pfinalState->LinkPtr).
             super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined4 *)
     ((long)&(pfinalState->LinkPtr).
             super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    this_00 = (NFA *)0x38;
    target = (NFANode *)operator_new(0x38);
    *(undefined8 *)&target->AcceptingState = 0;
    *(undefined8 *)
     ((long)&(target->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&(target->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(target->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)
     ((long)&(target->LinkPtr).
             super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&(target->LinkPtr).
             super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined4 *)
     ((long)&(target->LinkPtr).
             super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    local_50 = target;
    local_40 = target;
    if (pNVar4 != (NFANode *)0x0) {
      AddLink(this_00,pfinalState,0,pNVar4);
      ppNVar3 = (this->FinalState).
                super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppNVar2 = (this->FinalState).
                super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppNVar3 != ppNVar2) {
        do {
          pNVar4 = *ppNVar3;
          AddLink(this_00,pNVar4,0,target);
          pNVar4->AcceptingState = 0;
          ppNVar3 = ppNVar3 + 1;
        } while (ppNVar3 != ppNVar2);
        ppNVar3 = (this->FinalState).
                  super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->FinalState).
            super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppNVar3) {
          (this->FinalState).
          super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppNVar3;
        }
      }
    }
    pNVar4 = (NFANode *)&local_40->AcceptingState;
    if (local_38->pStartState != (NFANode *)0x0) {
      AddLink(this_00,pfinalState,0,local_38->pStartState);
      ppNVar3 = (local_38->FinalState).
                super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppNVar2 = (local_38->FinalState).
                super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppNVar3 != ppNVar2) {
        do {
          local_40 = pNVar4;
          pNVar4 = *ppNVar3;
          AddLink(this_00,pNVar4,0,target);
          pNVar4->AcceptingState = 0;
          ppNVar3 = ppNVar3 + 1;
          pNVar4 = local_40;
        } while (ppNVar3 != ppNVar2);
        ppNVar3 = (local_38->FinalState).
                  super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((local_38->FinalState).
            super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppNVar3) {
          (local_38->FinalState).
          super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppNVar3;
        }
      }
    }
    this->pStartState = pfinalState;
    pNVar4->Id = this->LexemeId;
    __position._M_current =
         (this->FinalState).
         super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->FinalState).
        super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>::
      _M_realloc_insert<SGParser::Generator::NFANode*const&>
                ((vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>
                  *)&this->FinalState,__position,&local_50);
    }
    else {
      *__position._M_current = target;
      pppNVar1 = &(this->FinalState).
                  super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    local_38->pStartState = (NFANode *)0x0;
  }
  return;
}

Assistant:

void NFA::Or(NFA& b) {
    // Same as us
    if (this == &b)
        return;
    if (!pStartState && !b.pStartState)
        return;

    const auto pnewStartState = NewState(0u);
    const auto pfinalState    = NewState(0u);

    // Connect the start state to the start states of this and b
    // with epsilon transitions
    if (pStartState) {
        AddLink(pnewStartState, NFANode::Epsilon, pStartState);

        // Connect all the final states of a and b to the new final state
        // Make the final states of a and b no longer final states
        for (const auto fs : FinalState) {
            AddLink(fs, NFANode::Epsilon, pfinalState);
            fs->AcceptingState = 0u;
        }
        FinalState.clear();
    }
    if (b.pStartState) {
        AddLink(pnewStartState, NFANode::Epsilon, b.pStartState);

        for (const auto fs : b.FinalState) {
            AddLink(fs, NFANode::Epsilon, pfinalState);
            fs->AcceptingState = 0u;
        }
        b.FinalState.clear();
    }

    // Set new start state
    pStartState = pnewStartState;
    // Make the state final
    pfinalState->AcceptingState = LexemeId;
    FinalState.push_back(pfinalState);

    // Release b's data
    b.pStartState = nullptr;
}